

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O3

int Test_N_VScaleAddMulti(N_Vector X,sunindextype param_2,int myid)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  timespec spec;
  int local_78;
  timespec local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  puVar4 = (undefined8 *)N_VCloneVectorArray(3,X);
  puVar5 = (undefined8 *)N_VCloneVectorArray(3,X);
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  N_VConst(0,X);
  N_VConst(0,*puVar5);
  local_48 = 0x4000000000000000;
  local_78 = 1;
  clock_gettime(1,&local_58);
  lVar6 = local_58.tv_sec - base_time_tv_sec;
  dVar8 = (double)local_58.tv_nsec;
  iVar1 = N_VScaleAddMulti(1,&local_48,X,puVar5,puVar5);
  sync_device(X);
  clock_gettime(1,&local_58);
  lVar7 = local_58.tv_sec - base_time_tv_sec;
  dVar9 = (double)local_58.tv_nsec;
  if ((iVar1 == 0) && (iVar1 = check_ans(1.0,(N_Vector)*puVar5,param_2), iVar1 == 0)) {
    local_78 = 0;
    if (myid == 0) {
      puts("PASSED test -- N_VScaleAddMulti Case 1a ");
    }
  }
  else {
    printf(">>> FAILED test -- N_VScaleAddMulti Case 1a, Proc %d \n",(ulong)(uint)myid);
  }
  dVar8 = max_time(X,(dVar9 / 1000000000.0 + (double)lVar7) - (dVar8 / 1000000000.0 + (double)lVar6)
                  );
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar8,0),"N_VScaleAddMulti");
  }
  N_VConst(0,X);
  N_VConst(0,*puVar5);
  local_48 = 0x4000000000000000;
  N_VConst(0,*puVar4);
  clock_gettime(1,&local_58);
  lVar6 = local_58.tv_sec - base_time_tv_sec;
  dVar9 = (double)local_58.tv_nsec;
  iVar1 = N_VScaleAddMulti(1,&local_48,X,puVar5,puVar4);
  sync_device(X);
  clock_gettime(1,&local_58);
  lVar7 = local_58.tv_sec - base_time_tv_sec;
  dVar8 = (double)local_58.tv_nsec;
  if ((iVar1 == 0) && (iVar1 = check_ans(1.0,(N_Vector)*puVar4,param_2), iVar1 == 0)) {
    if (myid == 0) {
      puts("PASSED test -- N_VScaleAddMulti Case 1b ");
    }
  }
  else {
    printf(">>> FAILED test -- N_VScaleAddMulti Case 1b, Proc %d \n",(ulong)(uint)myid);
    local_78 = local_78 + 1;
  }
  dVar8 = max_time(X,(dVar8 / 1000000000.0 + (double)lVar7) - (dVar9 / 1000000000.0 + (double)lVar6)
                  );
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar8,0),"N_VScaleAddMulti");
  }
  N_VConst(0,X);
  N_VConst(0,*puVar5);
  N_VConst(0,puVar5[1]);
  N_VConst(0,puVar5[2]);
  local_48 = 0x3ff0000000000000;
  uStack_40 = 0xc000000000000000;
  local_38 = 0x4000000000000000;
  clock_gettime(1,&local_58);
  lVar6 = local_58.tv_sec - base_time_tv_sec;
  dVar9 = (double)local_58.tv_nsec;
  iVar1 = N_VScaleAddMulti(3,&local_48,X,puVar5,puVar5);
  sync_device(X);
  clock_gettime(1,&local_58);
  lVar7 = local_58.tv_sec - base_time_tv_sec;
  dVar8 = (double)local_58.tv_nsec;
  if (iVar1 == 0) {
    iVar1 = check_ans(-1.0,(N_Vector)*puVar5,param_2);
    iVar2 = check_ans(0.0,(N_Vector)puVar5[1],param_2);
    iVar3 = check_ans(1.0,(N_Vector)puVar5[2],param_2);
    if (iVar3 + iVar2 + iVar1 != 0) goto LAB_0010857b;
    if (myid == 0) {
      puts("PASSED test -- N_VScaleAddMulti Case 2a ");
    }
  }
  else {
LAB_0010857b:
    printf(">>> FAILED test -- N_VScaleAddMulti Case 2a, Proc %d \n",(ulong)(uint)myid);
    local_78 = local_78 + 1;
  }
  dVar8 = max_time(X,(dVar8 / 1000000000.0 + (double)lVar7) - (dVar9 / 1000000000.0 + (double)lVar6)
                  );
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar8,0),"N_VScaleAddMulti");
  }
  N_VConst(0,X);
  N_VConst(0,*puVar5);
  N_VConst(0,puVar5[1]);
  N_VConst(0,puVar5[2]);
  local_48 = 0x3ff0000000000000;
  uStack_40 = 0xc000000000000000;
  local_38 = 0x4000000000000000;
  N_VConst(0,*puVar4);
  N_VConst(0,puVar4[1]);
  N_VConst(0,puVar4[2]);
  clock_gettime(1,&local_58);
  lVar6 = local_58.tv_sec - base_time_tv_sec;
  dVar8 = (double)local_58.tv_nsec;
  iVar1 = N_VScaleAddMulti(3,&local_48,X,puVar5,puVar4);
  sync_device(X);
  clock_gettime(1,&local_58);
  lVar7 = local_58.tv_sec - base_time_tv_sec;
  if (iVar1 == 0) {
    iVar1 = check_ans(-1.0,(N_Vector)*puVar4,param_2);
    iVar2 = check_ans(0.0,(N_Vector)puVar4[1],param_2);
    iVar3 = check_ans(1.0,(N_Vector)puVar4[2],param_2);
    if (iVar3 + iVar2 + iVar1 == 0) {
      if (myid == 0) {
        puts("PASSED test -- N_VScaleAddMulti Case 2b ");
      }
      goto LAB_00108776;
    }
  }
  printf(">>> FAILED test -- N_VScaleAddMulti Case 2b, Proc %d \n",(ulong)(uint)myid);
  local_78 = local_78 + 1;
LAB_00108776:
  dVar8 = max_time(X,((double)local_58.tv_nsec / 1000000000.0 + (double)lVar7) -
                     (dVar8 / 1000000000.0 + (double)lVar6));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar8,0),"N_VScaleAddMulti");
  }
  N_VDestroyVectorArray(puVar4,3);
  N_VDestroyVectorArray(puVar5,3);
  return local_78;
}

Assistant:

int Test_N_VScaleAddMulti(N_Vector X, sunindextype local_length, int myid)
{
  int fails = 0, failure = 0, ierr = 0;
  double start_time, stop_time, maxt;

  sunrealtype avals[3];
  N_Vector *V, *Z;

  /* create vectors for testing */
  Z = N_VCloneVectorArray(3, X);
  V = N_VCloneVectorArray(3, X);

  /* initialize a values */
  avals[0] = ZERO;
  avals[1] = ZERO;
  avals[2] = ZERO;

  /*
   * Case 1a: V[0] = a[0] x + V[0], N_VLinearSum
   */

  /* fill vector data */
  N_VConst(ONE, X);
  N_VConst(NEG_ONE, V[0]);

  /* set scaling factors */
  avals[0] = TWO;

  start_time = get_time();
  ierr       = N_VScaleAddMulti(1, avals, X, V, V);
  sync_device(X);
  stop_time = get_time();

  /* V[0] should be vector of +1 */
  if (ierr == 0) { failure = check_ans(ONE, V[0], local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleAddMulti Case 1a, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VScaleAddMulti Case 1a \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMulti", maxt);

  /*
   * Case 1b: Z[0] = a[0] x + V[0], N_VLinearSum
   */

  /* fill vector data and set scaling factors */
  N_VConst(ONE, X);
  N_VConst(NEG_ONE, V[0]);

  avals[0] = TWO;

  N_VConst(ZERO, Z[0]);

  start_time = get_time();
  ierr       = N_VScaleAddMulti(1, avals, X, V, Z);
  sync_device(X);
  stop_time = get_time();

  /* Z[0] should be vector of +1 */
  if (ierr == 0) { failure = check_ans(ONE, Z[0], local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleAddMulti Case 1b, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VScaleAddMulti Case 1b \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMulti", maxt);

  /*
   * Case 2a: V[i] = a[i] x + V[i], N_VScaleAddMulti
   */

  /* fill vector data */
  N_VConst(ONE, X);
  N_VConst(NEG_TWO, V[0]);
  N_VConst(TWO, V[1]);
  N_VConst(NEG_ONE, V[2]);

  /* set scaling factors */
  avals[0] = ONE;
  avals[1] = NEG_TWO;
  avals[2] = TWO;

  start_time = get_time();
  ierr       = N_VScaleAddMulti(3, avals, X, V, V);
  sync_device(X);
  stop_time = get_time();

  /* V[i] should be a vector of -1, 0, +1 */
  if (ierr == 0)
  {
    failure = check_ans(NEG_ONE, V[0], local_length);
    failure += check_ans(ZERO, V[1], local_length);
    failure += check_ans(ONE, V[2], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleAddMulti Case 2a, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VScaleAddMulti Case 2a \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMulti", maxt);

  /*
   * Case 2b: Z[i] = a[i] x + V[i], N_VScaleAddMulti
   */

  /* fill vector data and set scaling factors */
  N_VConst(ONE, X);
  N_VConst(NEG_TWO, V[0]);
  N_VConst(TWO, V[1]);
  N_VConst(NEG_ONE, V[2]);

  avals[0] = ONE;
  avals[1] = NEG_TWO;
  avals[2] = TWO;

  N_VConst(TWO, Z[0]);
  N_VConst(TWO, Z[1]);
  N_VConst(TWO, Z[2]);

  start_time = get_time();
  ierr       = N_VScaleAddMulti(3, avals, X, V, Z);
  sync_device(X);
  stop_time = get_time();

  /* Z[i] should be a vector of -1, 0, +1 */
  if (ierr == 0)
  {
    failure = check_ans(NEG_ONE, Z[0], local_length);
    failure += check_ans(ZERO, Z[1], local_length);
    failure += check_ans(ONE, Z[2], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleAddMulti Case 2b, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VScaleAddMulti Case 2b \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMulti", maxt);

  /* Free vectors */
  N_VDestroyVectorArray(Z, 3);
  N_VDestroyVectorArray(V, 3);

  return (fails);
}